

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void x86_64_rshi(dill_stream s,int dest,int src,int imm)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int rex;
  
  if (in_ESI != in_EDX) {
    x86_64_pmov((dill_stream)CONCAT44(in_ESI,in_EDX),in_ECX,8,0);
  }
  BYTE_OUT3R((dill_stream)CONCAT44(imm,rex),(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_EDX);
  return;
}

Assistant:

static void
x86_64_rshi(dill_stream s, int dest, int src, int imm)
{
    int rex = REX_W;
    if (dest != src) {
        x86_64_movl(s, dest, src);
    }
    if (dest > RDI)
        rex |= REX_B;
    BYTE_OUT3R(s, rex, 0xc1, ModRM(0x3, 0x5, dest), imm & 0xff);
}